

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O2

void __thiscall HighsNodeQueue::clear(HighsNodeQueue *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  HighsNodeQueue nodequeue;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  pointer local_78;
  undefined1 local_68 [16];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  int64_t local_28;
  double local_20;
  HighsInt local_18;
  
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_78 = (pointer)0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  local_38 = 0xffffffff;
  uStack_34 = 0xffffffff;
  uStack_30 = 0xffffffff;
  uStack_2c = 0xffffffff;
  local_28 = 0;
  local_20 = INFINITY;
  local_18 = 0;
  setNumCol((HighsNodeQueue *)local_a8,this->numCol);
  std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::_M_move_assign
            (&this->nodes,local_a8 + 8);
  uVar3 = local_68._0_8_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_68._8_8_;
  local_68 = auVar1 << 0x40;
  std::
  __uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
  ::reset((__uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
           *)&this->colLowerNodesPtr,(pointer)uVar3);
  uVar3 = local_68._8_8_;
  local_68._8_8_ = 0;
  std::
  __uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
  ::reset((__uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
           *)&this->colUpperNodesPtr,(pointer)uVar3);
  std::vector<long,_std::allocator<long>_>::_M_move_assign(&(this->freeslots).c,local_88);
  uVar3 = local_a8._0_8_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_a8._8_8_;
  local_a8 = auVar2 << 0x40;
  std::
  __uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
  ::reset((__uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
           *)this,(pointer)uVar3);
  this->lowerRoot = CONCAT44(uStack_54,local_58);
  this->lowerMin = CONCAT44(uStack_4c,uStack_50);
  this->hybridEstimRoot = CONCAT44(uStack_44,local_48);
  this->hybridEstimMin = CONCAT44(uStack_3c,uStack_40);
  this->suboptimalRoot = CONCAT44(uStack_34,local_38);
  this->suboptimalMin = CONCAT44(uStack_2c,uStack_30);
  this->numSuboptimal = local_28;
  this->optimality_limit = local_20;
  this->numCol = local_18;
  ~HighsNodeQueue((HighsNodeQueue *)local_a8);
  return;
}

Assistant:

SuboptimalNodeRbTree(HighsNodeQueue* nodeQueue)
      : CacheMinRbTree<SuboptimalNodeRbTree>(nodeQueue->suboptimalRoot,
                                             nodeQueue->suboptimalMin),
        nodeQueue(nodeQueue) {}